

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O1

void mpeg_bitstream_init(mpeg_bitstream_t *packet)

{
  packet->size = 0;
  packet->dts = 0.0;
  packet->cts = 0.0;
  packet->front = 0;
  packet->latent = 0;
  packet->status = LIBCAPTION_OK;
  return;
}

Assistant:

void mpeg_bitstream_init(mpeg_bitstream_t* packet)
{
    packet->dts = 0;
    packet->cts = 0;
    packet->size = 0;
    packet->front = 0;
    packet->latent = 0;
    packet->status = LIBCAPTION_OK;
}